

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

void __thiscall
QUrlPrivate::setUserInfo<QStringView>(QUrlPrivate *this,QStringView *value,ParsingMode mode)

{
  storage_type_conflict *psVar1;
  long lVar2;
  QArrayData *data;
  qsizetype qVar3;
  ParsingMode in_R8D;
  QStringView input;
  QStringView input_00;
  
  qVar3 = QStringView::indexOf(value,(QChar)0x3a,0,CaseSensitive);
  if (-1 < qVar3) {
    psVar1 = value->m_data;
    this->sectionIsPresent = this->sectionIsPresent | 2;
    input.m_data = psVar1;
    input.m_size = qVar3;
    recodeFromUser(&this->userName,input,userNameInIsolation,in_R8D);
    input_00.m_data = value->m_data + qVar3 + 1;
    lVar2 = value->m_size;
    this->sectionIsPresent = this->sectionIsPresent | 4;
    input_00.m_size = lVar2 - (qVar3 + 1);
    recodeFromUser(&this->password,input_00,userNameInIsolation + 1,in_R8D);
    return;
  }
  this->sectionIsPresent = this->sectionIsPresent | 2;
  recodeFromUser(&this->userName,*value,userNameInIsolation,in_R8D);
  if ((this->password).d.ptr != (char16_t *)0x0) {
    data = &((this->password).d.d)->super_QArrayData;
    (this->password).d.d = (Data *)0x0;
    (this->password).d.ptr = (char16_t *)0x0;
    (this->password).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  this->sectionIsPresent = this->sectionIsPresent & 0xfb;
  return;
}

Assistant:

void QUrlPrivate::setUserInfo(String &&value, QUrl::ParsingMode mode)
{
    Q_ASSERT_X(mode != QUrl::DecodedMode, "setUserInfo",
               "This function should only be called when parsing encoded components");
    qsizetype delimIndex = value.indexOf(u':');
    if (delimIndex < 0) {
        // no password
        setUserName(std::move(value), mode);
        password.clear();
        sectionIsPresent &= ~Password;
    } else {
        setUserName(value.first(delimIndex), mode);
        setPassword(value.sliced(delimIndex + 1), mode);
    }
}